

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteDTDEntity
              (xmlTextWriterPtr writer,int pe,xmlChar *name,xmlChar *pubid,xmlChar *sysid,
              xmlChar *ndataid,xmlChar *content)

{
  xmlChar *ndataid_local;
  xmlChar *sysid_local;
  xmlChar *pubid_local;
  xmlChar *name_local;
  int pe_local;
  xmlTextWriterPtr writer_local;
  
  if (((content == (xmlChar *)0x0) && (pubid == (xmlChar *)0x0)) && (sysid == (xmlChar *)0x0)) {
    writer_local._4_4_ = -1;
  }
  else if ((pe == 0) || (ndataid == (xmlChar *)0x0)) {
    if ((pubid == (xmlChar *)0x0) && (sysid == (xmlChar *)0x0)) {
      writer_local._4_4_ = xmlTextWriterWriteDTDInternalEntity(writer,pe,name,content);
    }
    else {
      writer_local._4_4_ = xmlTextWriterWriteDTDExternalEntity(writer,pe,name,pubid,sysid,ndataid);
    }
  }
  else {
    writer_local._4_4_ = -1;
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteDTDEntity(xmlTextWriterPtr writer,
                            int pe,
                            const xmlChar * name,
                            const xmlChar * pubid,
                            const xmlChar * sysid,
                            const xmlChar * ndataid,
                            const xmlChar * content)
{
    if ((content == NULL) && (pubid == NULL) && (sysid == NULL))
        return -1;
    if ((pe != 0) && (ndataid != NULL))
        return -1;

    if ((pubid == NULL) && (sysid == NULL))
        return xmlTextWriterWriteDTDInternalEntity(writer, pe, name,
                                                   content);

    return xmlTextWriterWriteDTDExternalEntity(writer, pe, name, pubid,
                                               sysid, ndataid);
}